

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cSparseTexture2Tests.cpp
# Opt level: O3

bool __thiscall
gl4cts::UncommittedRegionsAccessTestCase::UncommittedReads
          (UncommittedRegionsAccessTestCase *this,Functions *gl,GLint target,GLint format,
          GLuint *texture,GLint level)

{
  bool bVar1;
  GLenum err;
  int iVar2;
  int iVar3;
  undefined1 *puVar4;
  
  puVar4 = &(this->super_SparseTexture2CommitmentTestCase).super_SparseTextureCommitmentTestCase.
            field_0x88;
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)puVar4,"API Reads - ",0xc);
  bVar1 = verifyTextureDataExtended(this,gl,target,format,texture,level,false);
  if (bVar1) {
    bVar1 = true;
    if (((format != 0x8c3d) && (format != 0x8d62)) && (format != 0x906f)) {
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)puVar4,"Shader Reads - ",0xf);
      bVar1 = verifyTextureDataExtended(this,gl,target,format,texture,level,true);
    }
  }
  else {
    bVar1 = false;
  }
  if ((((target != 0x84f5 && level == 0) && (target & 0xfffffffdU) != 0x9100) & bVar1) == 1) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)puVar4,"Mipmap Generate - ",0x12);
    gl4cts::Texture::Bind(gl,*texture,target);
    (*gl->generateMipmap)(target);
    err = (*gl->getError)();
    glu::checkError(err,"glGenerateMipmap",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cSparseTexture2Tests.cpp"
                    ,0x5cc);
    iVar2 = (this->super_SparseTexture2CommitmentTestCase).super_SparseTextureCommitmentTestCase.
            mState.levels;
    if (1 < iVar2) {
      iVar3 = 1;
      do {
        if (bVar1 == false) {
          bVar1 = false;
        }
        else {
          bVar1 = verifyTextureDataExtended(this,gl,target,format,texture,0,false);
          iVar2 = (this->super_SparseTexture2CommitmentTestCase).
                  super_SparseTextureCommitmentTestCase.mState.levels;
        }
        iVar3 = iVar3 + 1;
      } while (iVar3 < iVar2);
    }
  }
  return bVar1;
}

Assistant:

bool UncommittedRegionsAccessTestCase::UncommittedReads(const Functions& gl, GLint target, GLint format,
														GLuint& texture, GLint level)
{
	bool result = true;

	// Verify using API glGetTexImage*
	if (readsAllowed(target, format, false))
	{
		mLog << "API Reads - ";
		result = result && verifyTextureDataExtended(gl, target, format, texture, level, false);
	}

	// Verify using shader imageLoad function
	if (result && readsAllowed(target, format, true))
	{
		mLog << "Shader Reads - ";
		result = result && verifyTextureDataExtended(gl, target, format, texture, level, true);
	}

	// Verify mipmap generating
	if (result && level == 0 && target != GL_TEXTURE_RECTANGLE && target != GL_TEXTURE_2D_MULTISAMPLE &&
		target != GL_TEXTURE_2D_MULTISAMPLE_ARRAY)
	{
		mLog << "Mipmap Generate - ";
		Texture::Bind(gl, texture, target);
		gl.generateMipmap(target);
		GLU_EXPECT_NO_ERROR(gl.getError(), "glGenerateMipmap");

		for (int l = 1; l < mState.levels; ++l)
			result = result && verifyTextureDataExtended(gl, target, format, texture, level, false);
	}

	return result;
}